

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int quantize_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  uint32_t i;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint32_t samples;
  float local_38;
  float local_34;
  float *in;
  float *local_28;
  
  puVar1 = (undefined8 *)segment->data;
  local_34 = *(float *)(puVar1 + 2);
  local_38 = *(float *)((long)puVar1 + 0x14);
  samples = 0xffffffff;
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&in,&samples,buffer);
  if (buffer == buffer_00) {
    for (uVar2 = 0; samples != uVar2; uVar2 = uVar2 + 1) {
      auVar3 = ZEXT416((uint)(local_34 * in[uVar2]));
      auVar3 = vroundss_avx(auVar3,auVar3,9);
      in[uVar2] = in[uVar2] * (1.0 - local_38) + local_38 * (auVar3._0_4_ / local_34);
    }
  }
  else {
    mixed_buffer_request_write(&local_28,&samples,buffer_00);
    for (uVar2 = 0; samples != uVar2; uVar2 = uVar2 + 1) {
      auVar3 = ZEXT416((uint)(local_34 * in[uVar2]));
      auVar3 = vroundss_avx(auVar3,auVar3,9);
      local_28[uVar2] = in[uVar2] * (1.0 - local_38) + local_38 * (auVar3._0_4_ / local_34);
    }
    mixed_buffer_finish_read(samples,buffer);
    mixed_buffer_finish_write(samples,buffer_00);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}